

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbridge.c
# Opt level: O1

boolean e_jumps(entity *etmp)

{
  monst *pmVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  pmVar1 = etmp->emon;
  if (pmVar1 == &youmonst) {
    if (u.uprops[0x1f].intrinsic != 0) {
      return '\0';
    }
    if (u.uprops[0x1f].extrinsic != 0) {
      return '\0';
    }
    if (u.uprops[0x25].intrinsic != 0) {
      return '\0';
    }
    if (u.uprops[0x25].extrinsic != 0) {
      return '\0';
    }
  }
  else if ((((*(uint *)&pmVar1->field_0x60 & 0xc0000) != 0x40000) || (etmp->edata->mmove == '\0'))
          || (pmVar1->wormno != '\0')) {
    return '\0';
  }
  if (pmVar1 == &youmonst) {
    if (u.uprops[0x1c].intrinsic != 0) goto LAB_0015f721;
    iVar2 = 4;
  }
  else {
    iVar2 = 4;
    if ((pmVar1->field_0x62 & 0x20) != 0) {
LAB_0015f721:
      iVar2 = 2;
    }
  }
  if (pmVar1 == &youmonst) {
    if (((u.uprops[0x1b].intrinsic == 0) && (u.umonnum != 0x9e)) &&
       ((youmonst.data)->mlet != '\x1c')) goto LAB_0015f76e;
  }
  else if ((pmVar1->field_0x62 & 0x10) == 0) goto LAB_0015f76e;
  iVar2 = iVar2 + -3;
LAB_0015f76e:
  iVar4 = iVar2 + -2;
  if (level->locations[etmp->ex][etmp->ey].typ != '\f') {
    iVar4 = iVar2;
  }
  uVar3 = mt_random();
  return (int)(uVar3 % 10) < iVar4;
}

Assistant:

static boolean e_jumps(struct entity *etmp)
{
	int tmp = 4;		/* out of 10 */

	if (is_u(etmp)? (Sleeping || Fumbling) :
		        (!etmp->emon->mcanmove || etmp->emon->msleeping ||
			 !etmp->edata->mmove   || etmp->emon->wormno))
		return FALSE;

	if (is_u(etmp)? Confusion : etmp->emon->mconf)
		tmp -= 2;

	if (is_u(etmp)? Stunned : etmp->emon->mstun)
		tmp -= 3;

	if (is_db_wall(etmp->ex, etmp->ey))
		tmp -= 2;			    /* less room to maneuver */

	return (boolean)((tmp >= rnd(10))? TRUE : FALSE);
}